

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_29c3b1::MiniscriptDescriptor::ToStringHelper
          (MiniscriptDescriptor *this,SigningProvider *arg,string *out,StringType type,
          DescriptorCache *cache)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MiniscriptContext MVar2;
  Fragment FVar3;
  Node<unsigned_int> *pNVar4;
  ulong uVar5;
  pointer psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte bVar8;
  void *pvVar9;
  void *pvVar10;
  long in_FS_OFFSET;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> subs;
  bool child_state;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  bool local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  void *local_d8;
  void *pvStack_d0;
  long local_c8;
  bool local_b1;
  SigningProvider *local_b0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *local_a8;
  undefined1 local_a0;
  SigningProvider **local_98;
  undefined1 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  byte local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar4 = (this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_a8 = &(this->super_DescriptorImpl).m_pubkey_args;
  local_a0 = type == PRIVATE;
  MVar2 = pNVar4->m_script_ctx;
  local_b0 = arg;
  if (MVar2 == P2WSH) {
    local_90 = 0;
  }
  else {
    if (MVar2 != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    local_90 = 1;
  }
  local_98 = &local_b0;
  local_b1 = false;
  local_c8 = 0;
  local_d8 = (void *)0x0;
  pvStack_d0 = (void *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
  ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
              *)&local_d8,pNVar4,(int *)&local_60,&local_b1);
  pvVar10 = local_d8;
  if (pvStack_d0 != local_d8) {
    pvVar9 = pvStack_d0;
    do {
      pNVar4 = *(Node<unsigned_int> **)((long)pvVar9 + -0x18);
      uVar5 = *(ulong *)((long)pvVar9 + -0x10);
      subs.m_size = (long)(pNVar4->subs).
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar4->subs).
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (uVar5 < subs.m_size) {
        *(ulong *)((long)pvVar9 + -0x10) = uVar5 + 1;
        FVar3 = pNVar4->fragment;
        psVar6 = (pNVar4->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f9 = true;
        if (6 < FVar3 - WRAP_A) {
          if (FVar3 == OR_I) {
            if (((psVar6->
                 super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->fragment != 0) {
              local_f9 = (psVar6[1].
                          super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->fragment == 0;
            }
          }
          else if (FVar3 == AND_V) {
            local_f9 = (psVar6[1].
                        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->fragment == 1;
          }
          else {
            local_f9 = false;
          }
        }
        local_60._M_dataplus._M_p._0_4_ = 0;
        std::
        vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
        ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
                  ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::ToString<(anonymous_namespace)::StringMaker>((anonymous_namespace)::StringMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
                    *)&local_d8,
                   psVar6[uVar5].
                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(int *)&local_60,&local_f9);
        pvVar9 = pvStack_d0;
        pvVar10 = local_d8;
      }
      else {
        if ((ulong)((long)local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) < subs.m_size) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:821:21)]"
                       );
        }
        subs.m_data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)local_f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      subs.m_size * -0x20 +
                      ((long)local_f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start));
        const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<std::__cxx11::string>)#1}::
        operator()::string_>__const
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,&local_98,*(bool *)((long)pvVar9 + -8),pNVar4,subs);
        bVar8 = local_40;
        if (local_40 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                     ((long)(pNVar4->subs).
                            super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pNVar4->subs).
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) * -2),
                     (iterator)
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     &local_60);
          pvVar9 = (void *)((long)pvVar9 + -0x18);
          pvStack_d0 = pvVar9;
        }
        if ((local_40 & 1) != 0) {
          local_40 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_
                                    ),local_60.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar8 == 0) {
          local_68 = 0;
          goto LAB_00176504;
        }
      }
    } while (pvVar9 != pvVar10);
    local_68 = 0;
  }
  if ((long)local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:821:21)]"
                 );
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  paVar1 = &(local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_2;
  if (paVar7 == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8);
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88._M_dataplus._M_p = (pointer)paVar7;
  }
  local_88._M_string_length =
       (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  ((local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)paVar1;
  (local_f8.
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0;
  ((local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_local_buf[0] = '\0';
  local_68 = 1;
LAB_00176504:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,local_c8 - (long)pvVar10);
  }
  bVar8 = local_68;
  if (local_68 == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (out,&local_88);
  }
  if (((local_68 & 1) != 0) &&
     (local_68 = 0,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar8;
}

Assistant:

bool ToStringHelper(const SigningProvider* arg, std::string& out, const StringType type,
                        const DescriptorCache* cache = nullptr) const override
    {
        if (const auto res = m_node->ToString(StringMaker(arg, m_pubkey_args, type == StringType::PRIVATE))) {
            out = *res;
            return true;
        }
        return false;
    }